

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O0

void __thiscall foxxll::block_manager::block_manager(block_manager *this)

{
  size_t sVar1;
  reference pvVar2;
  Logger *pLVar3;
  instance_pointer this_00;
  file *pfVar4;
  disk_block_allocator *this_01;
  reference ppdVar5;
  ulong local_528;
  Logger local_520;
  LoggerVoidify local_3a1 [433];
  io_error *anon_var_0;
  ulong local_1d0;
  Logger local_1c8;
  LoggerVoidify local_49;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> local_48;
  disk_config *local_40;
  disk_config *cfg;
  size_t i;
  uint64_t total_size;
  config *config;
  block_manager *local_10;
  block_manager *this_local;
  
  local_10 = this;
  tlx::
  SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
  ::SimpleVector(&this->disk_files_);
  tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::SimpleVector
            (&this->block_allocators_);
  this->total_allocation_ = 0;
  this->current_allocation_ = 0;
  this->maximum_allocation_ = 0;
  std::mutex::mutex(&this->mutex_);
  total_size = (uint64_t)singleton<foxxll::config,_true>::get_instance();
  foxxll::config::check_initialized((config *)total_size);
  sVar1 = foxxll::config::disks_number((config *)total_size);
  this->ndisks_ = sVar1;
  tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::resize
            (&this->block_allocators_,this->ndisks_);
  tlx::
  SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
  ::resize(&this->disk_files_,this->ndisks_);
  i = 0;
  for (cfg = (disk_config *)0x0; cfg < (disk_config *)this->ndisks_;
      cfg = (disk_config *)&(cfg->path).field_0x1) {
    local_40 = foxxll::config::disk((config *)total_size,(size_t)cfg);
    if (local_40->queue == -1) {
      local_40->queue = (int)cfg;
    }
    create_file((foxxll *)&local_48,local_40,0xc,(int)cfg);
    pvVar2 = tlx::
             SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
             ::operator[](&this->disk_files_,(size_type)cfg);
    tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::operator=(pvVar2,&local_48);
    tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(&local_48);
    tlx::Logger::Logger(&local_1c8);
    pLVar3 = tlx::Logger::operator<<(&local_1c8,(char (*) [15])"foxxll: Disk \'");
    pLVar3 = tlx::Logger::operator<<(pLVar3,&local_40->path);
    pLVar3 = tlx::Logger::operator<<(pLVar3,(char (*) [24])"\' is allocated, space: ");
    local_1d0 = local_40->size >> 0x14;
    pLVar3 = tlx::Logger::operator<<(pLVar3,&local_1d0);
    pLVar3 = tlx::Logger::operator<<(pLVar3,(char (*) [27])" MiB, I/O implementation: ");
    disk_config::fileio_string_abi_cxx11_((string *)&anon_var_0,local_40);
    pLVar3 = tlx::Logger::operator<<
                       (pLVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &anon_var_0);
    tlx::LoggerVoidify::operator&(&local_49,pLVar3);
    std::__cxx11::string::~string((string *)&anon_var_0);
    tlx::Logger::~Logger(&local_1c8);
    i = i + local_40->size;
    this_00 = singleton<foxxll::disk_queues,_true>::get_instance();
    pvVar2 = tlx::
             SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
             ::operator[](&this->disk_files_,(size_type)cfg);
    pfVar4 = tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::get(pvVar2);
    disk_queues::make_queue(this_00,pfVar4);
    this_01 = (disk_block_allocator *)operator_new(0x80);
    pvVar2 = tlx::
             SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
             ::operator[](&this->disk_files_,(size_type)cfg);
    pfVar4 = tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::get(pvVar2);
    disk_block_allocator::disk_block_allocator(this_01,pfVar4,local_40);
    ppdVar5 = tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::
              operator[](&this->block_allocators_,(size_type)cfg);
    *ppdVar5 = this_01;
  }
  if (1 < this->ndisks_) {
    tlx::Logger::Logger(&local_520);
    pLVar3 = tlx::Logger::operator<<(&local_520,(char (*) [18])"foxxll: In total ");
    pLVar3 = tlx::Logger::operator<<(pLVar3,&this->ndisks_);
    pLVar3 = tlx::Logger::operator<<(pLVar3,(char (*) [30])" disks are allocated, space: ");
    local_528 = i >> 0x14;
    pLVar3 = tlx::Logger::operator<<(pLVar3,&local_528);
    pLVar3 = tlx::Logger::operator<<(pLVar3,(char (*) [5])" MiB");
    tlx::LoggerVoidify::operator&(local_3a1,pLVar3);
    tlx::Logger::~Logger(&local_520);
  }
  return;
}

Assistant:

block_manager::block_manager()
{
    config* config = config::get_instance();

    // initialize config (may read config files now)
    config->check_initialized();

    // allocate block_allocators_
    ndisks_ = config->disks_number();
    block_allocators_.resize(ndisks_);
    disk_files_.resize(ndisks_);

    uint64_t total_size = 0;

    for (size_t i = 0; i < ndisks_; ++i)
    {
        disk_config& cfg = config->disk(i);

        // assign queues in order of disks.
        if (cfg.queue == file::DEFAULT_QUEUE)
            cfg.queue = i;

        try
        {
            disk_files_[i] = create_file(cfg, file::CREAT | file::RDWR, i);

            TLX_LOG1 << "foxxll: Disk '" << cfg.path << "' is allocated, space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
        }
        catch (io_error&)
        {
            TLX_LOG1 << "foxxll: Error allocating disk '" << cfg.path << "', space: "
                     << (cfg.size) / (1024 * 1024)
                     << " MiB, I/O implementation: " << cfg.fileio_string();
            throw;
        }

        total_size += cfg.size;

        // create queue for the file.
        disk_queues::get_instance()->make_queue(disk_files_[i].get());

        block_allocators_[i] = new disk_block_allocator(disk_files_[i].get(), cfg);
    }

    if (ndisks_ > 1)
    {
        TLX_LOG1 << "foxxll: In total " << ndisks_ << " disks are allocated, space: "
                 << (total_size / (1024 * 1024)) << " MiB";
    }
}